

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig
          (cmInstallImportedRuntimeArtifactsGenerator *this,ostream *os,string *config,Indent indent
          )

{
  char **ppcVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  allocator_type local_339;
  string bundleDir;
  string bundleName;
  string bundlePath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  pointer local_298;
  undefined8 local_290;
  undefined8 local_288;
  char *local_280;
  undefined8 local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  string location;
  RegularExpressionMatch match;
  
  cmGeneratorTarget::GetFullPath(&location,this->Target,config,RuntimeBinaryArtifact,false);
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if (TVar3 == EXECUTABLE) {
    bVar2 = cmGeneratorTarget::IsBundleOnApple(this->Target);
    if (bVar2) {
      memset(&match,0,0x208);
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::BundleRegularExpression,
                         location._M_dataplus._M_p,&match);
      if (!bVar2) goto LAB_005580c0;
      if (match.startp[1] == (char *)0x0) {
        bundleDir._M_dataplus._M_p = (pointer)&bundleDir.field_2;
        bundleDir._M_string_length = 0;
        bundleDir.field_2._M_local_buf[0] = '\0';
      }
      else {
        bundleDir._M_dataplus._M_p = (pointer)&bundleDir.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&bundleDir,match.startp[1],match.endp[1]);
      }
      if (match.startp[2] == (char *)0x0) {
        bundleName._M_dataplus._M_p = (pointer)&bundleName.field_2;
        bundleName._M_string_length = 0;
        bundleName.field_2._M_local_buf[0] = '\0';
      }
      else {
        bundleName._M_dataplus._M_p = (pointer)&bundleName.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&bundleName,match.startp[2],match.endp[2]);
      }
      local_2b8._M_allocated_capacity = bundleDir._M_string_length;
      local_2b8._8_8_ = bundleDir._M_dataplus._M_p;
      local_2a8._M_allocated_capacity = 0;
      local_290 = 0;
      local_288 = 4;
      local_280 = ".app";
      local_278 = 0;
      views_01._M_len = 3;
      views_01._M_array = (iterator)&local_2b8;
      local_2a8._8_8_ = bundleName._M_string_length;
      local_298 = bundleName._M_dataplus._M_p;
      cmCatViews(&bundlePath,views_01);
      GetDestination((string *)&local_2b8,this,config);
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&files,bundlePath._M_dataplus._M_p,
                 bundlePath._M_dataplus._M_p + bundlePath._M_string_length);
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)&files;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_270,__l_03,&local_339);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,(string *)&local_2b8,cmInstallType_DIRECTORY,
                 &local_270,this->Optional,(char *)0x0,(this->FilePermissions)._M_dataplus._M_p,
                 (char *)0x0," USE_SOURCE_PERMISSIONS",indent,(char *)0x0);
      goto LAB_00558027;
    }
    GetDestination((string *)&match,this,config);
    local_2b8._M_allocated_capacity = (size_type)&local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,location._M_dataplus._M_p,
               location._M_dataplus._M_p + location._M_string_length);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_2b8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&bundleDir,__l_00,(allocator_type *)&bundleName);
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,(string *)&match,cmInstallType_EXECUTABLE,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&bundleDir,this->Optional,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
               (char *)0x0,(char *)0x0,indent,(char *)0x0);
LAB_00557bf3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&bundleDir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_allocated_capacity != &local_2a8) {
      operator_delete((void *)local_2b8._M_allocated_capacity,
                      (ulong)(local_2a8._M_allocated_capacity + 1));
    }
    pcVar5 = match.startp[2];
    _Var6._M_p = match.startp[0];
    if ((char **)match.startp[0] == match.startp + 2) goto LAB_005580c0;
  }
  else {
    if (TVar3 == SHARED_LIBRARY) {
      bVar2 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (!bVar2) {
        ppcVar1 = match.startp + 2;
        match.startp[0] = (char *)ppcVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&match,location._M_dataplus._M_p,
                   location._M_dataplus._M_p + location._M_string_length);
        __l._M_len = 1;
        __l._M_array = (iterator)&match;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&files,__l,(allocator_type *)local_2b8._M_local_buf);
        if ((char **)match.startp[0] != ppcVar1) {
          operator_delete(match.startp[0],(ulong)(match.startp[2] + 1));
        }
        cmGeneratorTarget::GetSOName(&bundleDir,this->Target,config,RuntimeBinaryArtifact);
        cmGeneratorTarget::GetDirectory(&bundlePath,this->Target,config,RuntimeBinaryArtifact);
        match.startp[0] = (char *)bundlePath._M_string_length;
        match.startp[1] = bundlePath._M_dataplus._M_p;
        local_2a8._M_allocated_capacity = (size_type)(local_2a8._M_local_buf + 8);
        local_2b8._M_allocated_capacity = 0;
        local_2b8._8_8_ = (pointer)0x1;
        local_2a8._M_local_buf[8] = 0x2f;
        match.startp[3] = (char *)0x1;
        match.startp[5] = (char *)0x0;
        match.startp[6] = (char *)bundleDir._M_string_length;
        match.startp[7] = bundleDir._M_dataplus._M_p;
        match.startp[8] = (char *)0x0;
        views._M_len = 3;
        views._M_array = (iterator)&match;
        match.startp[2] = (char *)&bundlePath;
        match.startp[4] = (char *)local_2a8._M_allocated_capacity;
        cmCatViews(&bundleName,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bundlePath._M_dataplus._M_p != &bundlePath.field_2) {
          operator_delete(bundlePath._M_dataplus._M_p,bundlePath.field_2._M_allocated_capacity + 1);
        }
        if ((bundleDir._M_string_length != 0) &&
           ((bundleName._M_string_length != location._M_string_length ||
            ((bundleName._M_string_length != 0 &&
             (iVar4 = bcmp(bundleName._M_dataplus._M_p,location._M_dataplus._M_p,
                           bundleName._M_string_length), iVar4 != 0)))))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&files,&bundleName);
        }
        GetDestination((string *)&match,this,config);
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,(string *)&match,cmInstallType_SHARED_LIBRARY,
                   &files,this->Optional,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
                   (char *)0x0,(char *)0x0,indent,(char *)0x0);
        if ((char **)match.startp[0] != ppcVar1) {
          operator_delete(match.startp[0],(ulong)(match.startp[2] + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bundleName._M_dataplus._M_p != &bundleName.field_2) {
          operator_delete(bundleName._M_dataplus._M_p,
                          CONCAT71(bundleName.field_2._M_allocated_capacity._1_7_,
                                   bundleName.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bundleDir._M_dataplus._M_p != &bundleDir.field_2) {
          operator_delete(bundleDir._M_dataplus._M_p,
                          CONCAT71(bundleDir.field_2._M_allocated_capacity._1_7_,
                                   bundleDir.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&files);
        goto LAB_005580c0;
      }
      memset(&match,0,0x208);
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::FrameworkRegularExpression,
                         location._M_dataplus._M_p,&match);
      if (!bVar2) goto LAB_005580c0;
      if (match.startp[1] == (char *)0x0) {
        bundleDir._M_dataplus._M_p = (pointer)&bundleDir.field_2;
        bundleDir._M_string_length = 0;
        bundleDir.field_2._M_local_buf[0] = '\0';
      }
      else {
        bundleDir._M_dataplus._M_p = (pointer)&bundleDir.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&bundleDir,match.startp[1],match.endp[1]);
      }
      if (match.startp[2] == (char *)0x0) {
        bundleName._M_dataplus._M_p = (pointer)&bundleName.field_2;
        bundleName._M_string_length = 0;
        bundleName.field_2._M_local_buf[0] = '\0';
      }
      else {
        bundleName._M_dataplus._M_p = (pointer)&bundleName.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&bundleName,match.startp[2],match.endp[2]);
      }
      local_2b8._M_allocated_capacity = bundleDir._M_string_length;
      local_2b8._8_8_ = bundleDir._M_dataplus._M_p;
      local_2a8._M_allocated_capacity = 0;
      local_290 = 0;
      local_288 = 10;
      local_280 = ".framework";
      local_278 = 0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)&local_2b8;
      local_2a8._8_8_ = bundleName._M_string_length;
      local_298 = bundleName._M_dataplus._M_p;
      cmCatViews(&bundlePath,views_00);
      GetDestination((string *)&local_2b8,this,config);
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&files,bundlePath._M_dataplus._M_p,
                 bundlePath._M_dataplus._M_p + bundlePath._M_string_length);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&files;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_270,__l_02,&local_339);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,(string *)&local_2b8,cmInstallType_DIRECTORY,
                 &local_270,this->Optional,(char *)0x0,(this->FilePermissions)._M_dataplus._M_p,
                 (char *)0x0," USE_SOURCE_PERMISSIONS",indent,(char *)0x0);
    }
    else {
      if (TVar3 != MODULE_LIBRARY) {
        __assert_fail("false && \"This should never happen\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallImportedRuntimeArtifactsGenerator.cxx"
                      ,0x8f,
                      "virtual void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                     );
      }
      bVar2 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
      if (!bVar2) {
        GetDestination((string *)&match,this,config);
        local_2b8._M_allocated_capacity = (size_type)&local_2a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,location._M_dataplus._M_p,
                   location._M_dataplus._M_p + location._M_string_length);
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&local_2b8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&bundleDir,__l_01,(allocator_type *)&bundleName);
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,(string *)&match,cmInstallType_MODULE_LIBRARY,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&bundleDir,this->Optional,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0
                   ,(char *)0x0,(char *)0x0,indent,(char *)0x0);
        goto LAB_00557bf3;
      }
      memset(&match,0,0x208);
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::CFBundleRegularExpression,
                         location._M_dataplus._M_p,&match);
      if (!bVar2) goto LAB_005580c0;
      if (match.startp[1] == (char *)0x0) {
        bundleDir._M_dataplus._M_p = (pointer)&bundleDir.field_2;
        bundleDir._M_string_length = 0;
        bundleDir.field_2._M_local_buf[0] = '\0';
      }
      else {
        bundleDir._M_dataplus._M_p = (pointer)&bundleDir.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&bundleDir,match.startp[1],match.endp[1]);
      }
      if (match.startp[2] == (char *)0x0) {
        bundleName._M_dataplus._M_p = (pointer)&bundleName.field_2;
        bundleName._M_string_length = 0;
        bundleName.field_2._M_local_buf[0] = '\0';
      }
      else {
        bundleName._M_dataplus._M_p = (pointer)&bundleName.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&bundleName,match.startp[2],match.endp[2]);
      }
      local_2b8._M_allocated_capacity = bundleDir._M_string_length;
      local_2b8._8_8_ = bundleDir._M_dataplus._M_p;
      local_2a8._M_allocated_capacity = 0;
      local_290 = 0;
      local_288 = 7;
      local_280 = ".bundle";
      local_278 = 0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)&local_2b8;
      local_2a8._8_8_ = bundleName._M_string_length;
      local_298 = bundleName._M_dataplus._M_p;
      cmCatViews(&bundlePath,views_02);
      GetDestination((string *)&local_2b8,this,config);
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&files,bundlePath._M_dataplus._M_p,
                 bundlePath._M_dataplus._M_p + bundlePath._M_string_length);
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)&files;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_270,__l_04,&local_339);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,(string *)&local_2b8,cmInstallType_DIRECTORY,
                 &local_270,this->Optional,(char *)0x0,(this->FilePermissions)._M_dataplus._M_p,
                 (char *)0x0," USE_SOURCE_PERMISSIONS",indent,(char *)0x0);
    }
LAB_00558027:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_270);
    if (files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((files.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_allocated_capacity != &local_2a8) {
      operator_delete((void *)local_2b8._M_allocated_capacity,
                      (ulong)(local_2a8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bundlePath._M_dataplus._M_p != &bundlePath.field_2) {
      operator_delete(bundlePath._M_dataplus._M_p,bundlePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bundleName._M_dataplus._M_p != &bundleName.field_2) {
      operator_delete(bundleName._M_dataplus._M_p,
                      CONCAT71(bundleName.field_2._M_allocated_capacity._1_7_,
                               bundleName.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bundleDir._M_dataplus._M_p == &bundleDir.field_2) goto LAB_005580c0;
    pcVar5 = (char *)CONCAT71(bundleDir.field_2._M_allocated_capacity._1_7_,
                              bundleDir.field_2._M_local_buf[0]);
    _Var6._M_p = bundleDir._M_dataplus._M_p;
  }
  operator_delete(_Var6._M_p,(ulong)(pcVar5 + 1));
LAB_005580c0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)location._M_dataplus._M_p != &location.field_2) {
    operator_delete(location._M_dataplus._M_p,location.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  auto location = this->Target->GetFullPath(config);

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      if (this->Target->IsBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (BundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".app");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_EXECUTABLE, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::SHARED_LIBRARY:
      if (this->Target->IsFrameworkOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (FrameworkRegularExpression.find(location.c_str(), match)) {
          auto frameworkDir = match.match(1);
          auto frameworkName = match.match(2);
          auto frameworkPath =
            cmStrCat(frameworkDir, frameworkName, ".framework");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { frameworkPath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        std::vector<std::string> files{ location };
        auto soName = this->Target->GetSOName(config);
        auto soNameFile =
          cmStrCat(this->Target->GetDirectory(config), '/', soName);
        if (!soName.empty() && soNameFile != location) {
          files.push_back(soNameFile);
        }
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_SHARED_LIBRARY, files,
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::MODULE_LIBRARY:
      if (this->Target->IsCFBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (CFBundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".bundle");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_MODULE_LIBRARY, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    default:
      assert(false && "This should never happen");
      break;
  }
}